

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_sum_rows(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  long lVar12;
  char *pcVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  float fVar20;
  long local_68;
  long local_60;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x7df,"fatal error");
  }
  if (params->ith == 0) {
    if (pgVar1->nb[0] == 4) {
      if (dst->nb[0] == 4) {
        if (dst->ne[0] == 1) {
          lVar2 = pgVar1->ne[1];
          if (dst->ne[1] == lVar2) {
            lVar3 = pgVar1->ne[2];
            if (dst->ne[2] == lVar3) {
              lVar4 = pgVar1->ne[3];
              if (dst->ne[3] == lVar4) {
                if (lVar4 < 1) {
                  return;
                }
                sVar5 = pgVar1->nb[1];
                sVar6 = pgVar1->nb[2];
                sVar7 = pgVar1->nb[3];
                sVar8 = dst->nb[1];
                sVar9 = dst->nb[2];
                sVar10 = dst->nb[3];
                uVar15 = (uint)pgVar1->ne[0];
                local_60 = 0;
                local_68 = 0;
                do {
                  if (0 < lVar3) {
                    lVar16 = 0;
                    lVar17 = local_60;
                    do {
                      if (0 < lVar2) {
                        pvVar11 = dst->data;
                        lVar19 = (long)pgVar1->data + lVar17;
                        lVar12 = 0;
                        do {
                          if ((int)uVar15 < 1) {
                            fVar20 = 0.0;
                          }
                          else {
                            fVar20 = 0.0;
                            uVar18 = 0;
                            do {
                              fVar20 = fVar20 + *(float *)(lVar19 + uVar18 * 4);
                              uVar18 = uVar18 + 1;
                            } while ((uVar15 & 0x7fffffff) != uVar18);
                          }
                          *(float *)((long)pvVar11 +
                                    lVar12 * sVar8 + local_68 * sVar10 + lVar16 * sVar9) = fVar20;
                          lVar12 = lVar12 + 1;
                          lVar19 = lVar19 + sVar5;
                        } while (lVar12 != lVar2);
                      }
                      lVar16 = lVar16 + 1;
                      lVar17 = lVar17 + sVar6;
                    } while (lVar16 != lVar3);
                  }
                  local_68 = local_68 + 1;
                  local_60 = local_60 + sVar7;
                } while (local_68 != lVar4);
                return;
              }
              pcVar13 = "ne3 == ne03";
              uVar14 = 0x7c3;
            }
            else {
              pcVar13 = "ne2 == ne02";
              uVar14 = 0x7c2;
            }
          }
          else {
            pcVar13 = "ne1 == ne01";
            uVar14 = 0x7c1;
          }
        }
        else {
          pcVar13 = "ne0 == 1";
          uVar14 = 0x7c0;
        }
      }
      else {
        pcVar13 = "dst->nb[0] == sizeof(float)";
        uVar14 = 0x7bc;
      }
    }
    else {
      pcVar13 = "src0->nb[0] == sizeof(float)";
      uVar14 = 0x7bb;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,uVar14,"GGML_ASSERT(%s) failed",pcVar13);
  }
  return;
}

Assistant:

void ggml_compute_forward_sum_rows(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_sum_rows_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}